

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOGetTypedIntArray(FmsIOContext *ctx,char *path,FmsIntType *type,void **values,FmsInt *n)

{
  int iVar1;
  ulonglong uVar2;
  int *piVar3;
  FmsIOContext *ctx_00;
  intmax_t iVar4;
  void *pvVar5;
  size_t sVar6;
  uintmax_t uVar7;
  char *pcVar8;
  undefined8 *in_RCX;
  uint *in_RDX;
  long in_RSI;
  ulong uVar9;
  long in_RDI;
  size_t *in_R8;
  char *newoff_7;
  char *off_7;
  size_t len_7;
  FmsInt i_7;
  uint64_t *data_7;
  char *newoff_6;
  char *off_6;
  size_t len_6;
  FmsInt i_6;
  uint32_t *data_6;
  char *newoff_5;
  char *off_5;
  size_t len_5;
  FmsInt i_5;
  uint16_t *data_5;
  char *newoff_4;
  char *off_4;
  size_t len_4;
  FmsInt i_4;
  uint8_t *data_4;
  char *newoff_3;
  char *off_3;
  size_t len_3;
  FmsInt i_3;
  int64_t *data_3;
  char *newoff_2;
  char *off_2;
  size_t len_2;
  FmsInt i_2;
  int32_t *data_2;
  char *newoff_1;
  char *off_1;
  size_t len_1;
  FmsInt i_1;
  int16_t *data_1;
  char *newoff;
  char *off;
  size_t len;
  FmsInt i;
  int8_t *data;
  char *kvalues;
  char *ktype;
  char *ksize;
  char v [512];
  char k [512];
  int err;
  char *in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa60;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffa61;
  undefined1 in_stack_fffffffffffffa62;
  undefined1 in_stack_fffffffffffffa63;
  undefined1 in_stack_fffffffffffffa64;
  undefined1 in_stack_fffffffffffffa65;
  undefined1 in_stack_fffffffffffffa66;
  undefined1 in_stack_fffffffffffffa67;
  char *in_stack_fffffffffffffa68;
  char *in_stack_fffffffffffffa70;
  char *local_588;
  ulong local_578;
  char *local_568;
  char *local_560;
  size_t local_558;
  ulong local_550;
  void *local_548;
  char *local_540;
  char *local_538;
  size_t local_530;
  ulong local_528;
  void *local_520;
  char *local_518;
  char *local_510;
  size_t local_508;
  ulong local_500;
  void *local_4f8;
  char *local_4f0;
  char *local_4e8;
  size_t local_4e0;
  ulong local_4d8;
  void *local_4d0;
  char *local_4c8;
  char *local_4c0;
  size_t local_4b8;
  ulong local_4b0;
  void *local_4a8;
  char *local_4a0;
  char *local_498;
  size_t local_490;
  ulong local_488;
  void *local_480;
  char *local_478;
  char *local_470;
  size_t local_468;
  ulong local_460;
  void *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char local_438 [512];
  char local_238 [160];
  char *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  FmsIOContext *in_stack_fffffffffffffe78;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RSI == 0) {
    local_4 = 2;
  }
  else if (in_RDX == (uint *)0x0) {
    local_4 = 3;
  }
  else if (in_RCX == (undefined8 *)0x0) {
    local_4 = 4;
  }
  else if (in_R8 == (size_t *)0x0) {
    local_4 = 5;
  }
  else {
    iVar1 = FmsIOReadKeyValue(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                              in_stack_fffffffffffffe68);
    if (iVar1 == 0) {
      local_440 = join_keys(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      iVar1 = strcmp(local_238,local_440);
      if (local_440 != (char *)0x0) {
        free(local_440);
      }
      if (iVar1 == 0) {
        uVar2 = strtoull(local_438,(char **)0x0,10);
        *in_R8 = uVar2;
        piVar3 = __errno_location();
        if (*piVar3 == 0x22) {
          local_4 = 8;
        }
        else {
          piVar3 = __errno_location();
          if (*piVar3 == 0x16) {
            local_4 = 9;
          }
          else {
            iVar1 = FmsIOReadKeyValue(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                      in_stack_fffffffffffffe68);
            if (iVar1 == 0) {
              local_448 = join_keys(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
              iVar1 = strcmp(local_238,local_448);
              if (local_448 != (char *)0x0) {
                free(local_448);
              }
              if (iVar1 == 0) {
                iVar1 = FmsGetIntTypeFromName(in_stack_fffffffffffffa58,(FmsIntType *)0x11d79a);
                if (iVar1 == 0) {
                  if (*in_R8 == 0) {
                    local_4 = 0;
                  }
                  else {
                    iVar1 = FmsIOReadKeyValue(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                              in_stack_fffffffffffffe68);
                    if (iVar1 == 0) {
                      local_450 = join_keys(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
                      iVar1 = strcmp(local_238,local_450);
                      if (local_450 != (char *)0x0) {
                        free(local_450);
                      }
                      if (iVar1 == 0) {
                        ctx_00 = (FmsIOContext *)(ulong)*in_RDX;
                        switch(ctx_00) {
                        case (FmsIOContext *)0x0:
                          local_458 = malloc(*in_R8);
                          local_460 = 0;
                          do {
                            local_468 = strlen(local_438);
                            local_470 = local_438;
                            local_478 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_470 = local_438 + 1;
                            }
                            while( true ) {
                              uVar10 = false;
                              if (local_468 != 0) {
                                uVar10 = local_460 < *in_R8;
                              }
                              if ((bool)uVar10 == false) break;
                              iVar4 = strtoimax(local_470,&local_478,10);
                              uVar9 = local_460 + 1;
                              *(char *)((long)local_458 + local_460) = (char)iVar4;
                              pcVar8 = local_478 + 1;
                              if (local_478[1] == ' ') {
                                pcVar8 = local_478 + 2;
                              }
                              local_478 = pcVar8;
                              local_460 = uVar9;
                              if (local_438 + local_468 <= local_478) break;
                              local_470 = local_478;
                            }
                            pcVar8 = strchr(local_438,0x5d);
                          } while ((pcVar8 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(uVar10,CONCAT16(
                                                  in_stack_fffffffffffffa66,
                                                  CONCAT15(in_stack_fffffffffffffa65,
                                                           CONCAT14(in_stack_fffffffffffffa64,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffa63,
                                                  CONCAT12(in_stack_fffffffffffffa62,
                                                           CONCAT11(in_stack_fffffffffffffa61,
                                                                    in_stack_fffffffffffffa60)))))))
                                                  ), iVar1 == 0));
                          *in_RCX = local_458;
                          break;
                        case (FmsIOContext *)0x1:
                          local_480 = malloc(*in_R8 << 1);
                          local_488 = 0;
                          do {
                            local_490 = strlen(local_438);
                            local_498 = local_438;
                            local_4a0 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_498 = local_438 + 1;
                            }
                            while( true ) {
                              uVar10 = false;
                              if (local_490 != 0) {
                                uVar10 = local_488 < *in_R8;
                              }
                              if ((bool)uVar10 == false) break;
                              iVar4 = strtoimax(local_498,&local_4a0,10);
                              uVar9 = local_488 + 1;
                              *(short *)((long)local_480 + local_488 * 2) = (short)iVar4;
                              pcVar8 = local_4a0 + 1;
                              if (local_4a0[1] == ' ') {
                                pcVar8 = local_4a0 + 2;
                              }
                              local_4a0 = pcVar8;
                              local_488 = uVar9;
                              if (local_438 + local_490 <= local_4a0) break;
                              local_498 = local_4a0;
                            }
                            pcVar8 = strchr(local_438,0x5d);
                          } while ((pcVar8 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(
                                                  in_stack_fffffffffffffa67,
                                                  CONCAT16(uVar10,CONCAT15(in_stack_fffffffffffffa65
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffa64,
                                                  CONCAT13(in_stack_fffffffffffffa63,
                                                           CONCAT12(in_stack_fffffffffffffa62,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffa61,
                                                  in_stack_fffffffffffffa60)))))))), iVar1 == 0));
                          *in_RCX = local_480;
                          break;
                        case (FmsIOContext *)0x2:
                          local_4a8 = malloc(*in_R8 << 2);
                          local_4b0 = 0;
                          do {
                            local_4b8 = strlen(local_438);
                            local_4c0 = local_438;
                            local_4c8 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_4c0 = local_438 + 1;
                            }
                            while( true ) {
                              uVar10 = false;
                              if (local_4b8 != 0) {
                                uVar10 = local_4b0 < *in_R8;
                              }
                              if ((bool)uVar10 == false) break;
                              iVar4 = strtoimax(local_4c0,&local_4c8,10);
                              uVar9 = local_4b0 + 1;
                              *(int *)((long)local_4a8 + local_4b0 * 4) = (int)iVar4;
                              pcVar8 = local_4c8 + 1;
                              if (local_4c8[1] == ' ') {
                                pcVar8 = local_4c8 + 2;
                              }
                              local_4c8 = pcVar8;
                              local_4b0 = uVar9;
                              if (local_438 + local_4b8 <= local_4c8) break;
                              local_4c0 = local_4c8;
                            }
                            pcVar8 = strchr(local_438,0x5d);
                          } while ((pcVar8 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(
                                                  in_stack_fffffffffffffa67,
                                                  CONCAT16(in_stack_fffffffffffffa66,
                                                           CONCAT15(uVar10,CONCAT14(
                                                  in_stack_fffffffffffffa64,
                                                  CONCAT13(in_stack_fffffffffffffa63,
                                                           CONCAT12(in_stack_fffffffffffffa62,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffa61,
                                                  in_stack_fffffffffffffa60)))))))), iVar1 == 0));
                          *in_RCX = local_4a8;
                          break;
                        case (FmsIOContext *)0x3:
                          local_4d0 = malloc(*in_R8 << 3);
                          local_4d8 = 0;
                          do {
                            local_4e0 = strlen(local_438);
                            local_4e8 = local_438;
                            local_4f0 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_4e8 = local_438 + 1;
                            }
                            while( true ) {
                              uVar10 = false;
                              if (local_4e0 != 0) {
                                uVar10 = local_4d8 < *in_R8;
                              }
                              if ((bool)uVar10 == false) break;
                              iVar4 = strtoimax(local_4e8,&local_4f0,10);
                              uVar9 = local_4d8 + 1;
                              *(intmax_t *)((long)local_4d0 + local_4d8 * 8) = iVar4;
                              pcVar8 = local_4f0 + 1;
                              if (local_4f0[1] == ' ') {
                                pcVar8 = local_4f0 + 2;
                              }
                              local_4f0 = pcVar8;
                              local_4d8 = uVar9;
                              if (local_438 + local_4e0 <= local_4f0) break;
                              local_4e8 = local_4f0;
                            }
                            pcVar8 = strchr(local_438,0x5d);
                          } while ((pcVar8 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(
                                                  in_stack_fffffffffffffa67,
                                                  CONCAT16(in_stack_fffffffffffffa66,
                                                           CONCAT15(in_stack_fffffffffffffa65,
                                                                    CONCAT14(uVar10,CONCAT13(
                                                  in_stack_fffffffffffffa63,
                                                  CONCAT12(in_stack_fffffffffffffa62,
                                                           CONCAT11(in_stack_fffffffffffffa61,
                                                                    in_stack_fffffffffffffa60)))))))
                                                  ), iVar1 == 0));
                          *in_RCX = local_4d0;
                          break;
                        case (FmsIOContext *)0x4:
                          local_4f8 = malloc(*in_R8);
                          local_500 = 0;
                          do {
                            local_508 = strlen(local_438);
                            local_510 = local_438;
                            local_518 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_510 = local_438 + 1;
                            }
                            while( true ) {
                              uVar10 = false;
                              if (local_508 != 0) {
                                uVar10 = local_500 < *in_R8;
                              }
                              if ((bool)uVar10 == false) break;
                              uVar7 = strtoumax(local_510,&local_518,10);
                              uVar9 = local_500 + 1;
                              *(char *)((long)local_4f8 + local_500) = (char)uVar7;
                              pcVar8 = local_518 + 1;
                              if (local_518[1] == ' ') {
                                pcVar8 = local_518 + 2;
                              }
                              local_518 = pcVar8;
                              local_500 = uVar9;
                              if (local_438 + local_508 <= local_518) break;
                              local_510 = local_518;
                            }
                            pcVar8 = strchr(local_438,0x5d);
                          } while ((pcVar8 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(
                                                  in_stack_fffffffffffffa67,
                                                  CONCAT16(in_stack_fffffffffffffa66,
                                                           CONCAT15(in_stack_fffffffffffffa65,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffa64,
                                                  CONCAT13(uVar10,CONCAT12(in_stack_fffffffffffffa62
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffa61,
                                                  in_stack_fffffffffffffa60)))))))), iVar1 == 0));
                          *in_RCX = local_4f8;
                          break;
                        case (FmsIOContext *)0x5:
                          local_520 = malloc(*in_R8 << 1);
                          local_528 = 0;
                          do {
                            local_530 = strlen(local_438);
                            local_538 = local_438;
                            local_540 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_538 = local_438 + 1;
                            }
                            while( true ) {
                              uVar10 = false;
                              if (local_530 != 0) {
                                uVar10 = local_528 < *in_R8;
                              }
                              if ((bool)uVar10 == false) break;
                              uVar7 = strtoumax(local_538,&local_540,10);
                              uVar9 = local_528 + 1;
                              *(short *)((long)local_520 + local_528 * 2) = (short)uVar7;
                              pcVar8 = local_540 + 1;
                              if (local_540[1] == ' ') {
                                pcVar8 = local_540 + 2;
                              }
                              local_540 = pcVar8;
                              local_528 = uVar9;
                              if (local_438 + local_530 <= local_540) break;
                              local_538 = local_540;
                            }
                            pcVar8 = strchr(local_438,0x5d);
                          } while ((pcVar8 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(
                                                  in_stack_fffffffffffffa67,
                                                  CONCAT16(in_stack_fffffffffffffa66,
                                                           CONCAT15(in_stack_fffffffffffffa65,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffa64,
                                                  CONCAT13(in_stack_fffffffffffffa63,
                                                           CONCAT12(uVar10,CONCAT11(
                                                  in_stack_fffffffffffffa61,
                                                  in_stack_fffffffffffffa60)))))))), iVar1 == 0));
                          *in_RCX = local_520;
                          break;
                        case (FmsIOContext *)0x6:
                          local_548 = malloc(*in_R8 << 2);
                          local_550 = 0;
                          do {
                            local_558 = strlen(local_438);
                            local_560 = local_438;
                            local_568 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_560 = local_438 + 1;
                            }
                            while( true ) {
                              uVar10 = false;
                              if (local_558 != 0) {
                                uVar10 = local_550 < *in_R8;
                              }
                              if ((bool)uVar10 == false) break;
                              uVar7 = strtoumax(local_560,&local_568,10);
                              uVar9 = local_550 + 1;
                              *(int *)((long)local_548 + local_550 * 4) = (int)uVar7;
                              pcVar8 = local_568 + 1;
                              if (local_568[1] == ' ') {
                                pcVar8 = local_568 + 2;
                              }
                              local_568 = pcVar8;
                              local_550 = uVar9;
                              if (local_438 + local_558 <= local_568) break;
                              local_560 = local_568;
                            }
                            pcVar8 = strchr(local_438,0x5d);
                          } while ((pcVar8 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(
                                                  in_stack_fffffffffffffa67,
                                                  CONCAT16(in_stack_fffffffffffffa66,
                                                           CONCAT15(in_stack_fffffffffffffa65,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffa64,
                                                  CONCAT13(in_stack_fffffffffffffa63,
                                                           CONCAT12(in_stack_fffffffffffffa62,
                                                                    CONCAT11(uVar10,
                                                  in_stack_fffffffffffffa60)))))))), iVar1 == 0));
                          *in_RCX = local_548;
                          break;
                        case (FmsIOContext *)0x7:
                          pvVar5 = malloc(*in_R8 << 3);
                          local_578 = 0;
                          do {
                            sVar6 = strlen(local_438);
                            local_588 = local_438;
                            pcVar8 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_588 = local_438 + 1;
                            }
                            do {
                              uVar10 = false;
                              if (sVar6 != 0) {
                                uVar10 = local_578 < *in_R8;
                              }
                              if ((bool)uVar10 == false) break;
                              uVar7 = strtoumax(local_588,(char **)&stack0xfffffffffffffa70,10);
                              uVar9 = local_578 + 1;
                              *(uintmax_t *)((long)pvVar5 + local_578 * 8) = uVar7;
                              local_588 = pcVar8 + 1;
                              if (*local_588 == ' ') {
                                local_588 = pcVar8 + 2;
                              }
                              pcVar8 = local_588;
                              local_578 = uVar9;
                            } while (local_588 < local_438 + sVar6);
                            pcVar8 = strchr(local_438,0x5d);
                          } while ((pcVar8 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(
                                                  in_stack_fffffffffffffa67,
                                                  CONCAT16(in_stack_fffffffffffffa66,
                                                           CONCAT15(in_stack_fffffffffffffa65,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffa64,
                                                  CONCAT13(in_stack_fffffffffffffa63,
                                                           CONCAT12(in_stack_fffffffffffffa62,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffa61,uVar10)))))))),
                                  iVar1 == 0));
                          *in_RCX = pvVar5;
                          break;
                        default:
                          return 0x10;
                        }
                        local_4 = 0;
                      }
                      else {
                        local_4 = 0xf;
                      }
                    }
                    else {
                      local_4 = 0xe;
                    }
                  }
                }
                else {
                  local_4 = 0xc;
                }
              }
              else {
                local_4 = 0xb;
              }
            }
            else {
              local_4 = 10;
            }
          }
        }
      }
      else {
        local_4 = 7;
      }
    }
    else {
      local_4 = 6;
    }
  }
  return local_4;
}

Assistant:

static int
FmsIOGetTypedIntArray(FmsIOContext *ctx, const char *path, FmsIntType *type,
                      void **values, FmsInt *n) {
  int err = 0;
  char k[FMS_BUFFER_SIZE], v[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  if(!type) E_RETURN(3);
  if(!values) E_RETURN(4);
  if(!n) E_RETURN(5);

  /* Arrays are written like:
      path/Size: n
      path/Type: type
      path/Values: [1,2,3,
      4,5,6
      7,8,9]
  */

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(6);

    char *ksize = join_keys(path, "Size");
    err = strcmp(k, ksize);
    FREE(ksize);
    // Path & key didn't match
    if(err)
      E_RETURN(7);

    *n = StrToFmsInt(v, NULL, 10);

    if (errno == ERANGE) { E_RETURN(8); }
    if (errno == EINVAL) { E_RETURN(9); }
  }

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(10);

    char *ktype= join_keys(path, "Type");
    err = strcmp(k, ktype);
    FREE(ktype);
    // Path & key didn't match
    if(err)
      E_RETURN(11);

    if(FmsGetIntTypeFromName(v, type))
      E_RETURN(12);
  }

  // Values does not get written if Size == 0
  if(*n == 0)
    return 0;

  if(FmsIOReadKeyValue(ctx, k, v))
    E_RETURN(14);

  char *kvalues = join_keys(path, "Values");
  err = strcmp(k, kvalues);
  FREE(kvalues);
  if(err)
    E_RETURN(15);

#define READ_ARRAY_DATA(DEST_T, FUNC) \
do { \
    DEST_T *data = malloc(sizeof(DEST_T) * *n); \
    FmsInt i = 0; \
    while(1) { \
        size_t len = strlen(v); \
        char *off = v, *newoff = NULL; \
        if(off[0] == '[') \
            off++; \
        while(len && i < *n) { \
            data[i++] = (DEST_T)FUNC(off, &newoff, 10); \
            newoff++; \
            if(*newoff == ' ') newoff++; /* Current flaw in the file format, last element has no trialing space */ \
            if(newoff >= v + len) break; \
            off = newoff; \
        }